

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

type * jsoncons::
       json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  error_code ec_00;
  error_code ec_01;
  error_code ec_02;
  bool bVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  error_category *peVar2;
  undefined8 uVar3;
  value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_RDI;
  string_view_type sVar4;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  converter_1;
  value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  converter;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *item;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  error_code ec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  error_code *in_stack_fffffffffffffec0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  error_code *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  conv_error *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  error_category *in_stack_fffffffffffffef0;
  error_code *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  semantic_tag sVar5;
  byte_string_view *in_stack_ffffffffffffff10;
  value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  semantic_tag tag;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_58;
  const_array_range_type local_50;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_40;
  undefined1 local_21;
  error_code local_20 [2];
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  sVar5 = (semantic_tag)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  this_00 = in_RDI;
  std::error_code::error_code(in_stack_fffffffffffffec0);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  if (bVar1) {
    local_21 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b2589);
    this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                     (in_stack_fffffffffffffec8);
    json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::visit_reserve_(in_RDI,this);
    local_50 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this);
    local_40 = &local_50;
    local_58._M_current =
         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_40);
    range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
    ::end(local_40);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator*(&local_58);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_char>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffec0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec0,
                 (value_type_conflict *)in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_58);
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string_view
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2b26df)
    ;
    if (bVar1) {
      value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::value_converter((value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffee0);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                (in_stack_fffffffffffffec8);
      value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::convert(in_RDI,in_stack_ffffffffffffff10,sVar5,in_stack_ffffffffffffff00);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        peVar2 = (error_category *)__cxa_allocate_exception(0x58);
        ec_00._M_cat = peVar2;
        ec_00._0_8_ = in_stack_fffffffffffffee8;
        conv_error::conv_error(in_stack_fffffffffffffee0,ec_00);
        __cxa_throw(peVar2,&conv_error::typeinfo,conv_error::~conv_error);
      }
      value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~value_converter((value_converter<jsoncons::byte_string_view,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)0x2b2839);
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>
                  (in_stack_fffffffffffffed0,(conv_errc)((ulong)uVar3 >> 0x20));
        ec_02._M_cat = in_stack_fffffffffffffef0;
        ec_02._0_8_ = in_stack_fffffffffffffee8;
        conv_error::conv_error(in_stack_fffffffffffffee0,ec_02);
        __cxa_throw(uVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
      value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffec0);
      uVar6 = 0;
      sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00
                        );
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                (in_stack_fffffffffffffec8);
      value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::convert<char>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,tag,
                      (error_code *)
                      CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar6,in_stack_ffffffffffffff60)))
      ;
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x58);
        ec_01._M_cat = in_stack_fffffffffffffef0;
        ec_01._0_8_ = sVar4._M_len;
        conv_error::conv_error((conv_error *)sVar4._M_str,ec_01);
        __cxa_throw(uVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
      value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)0x2b29dd);
    }
  }
  return (type *)this_00;
}

Assistant:

static typename std::enable_if<ext_traits::is_byte<typename Container::value_type>::value,Container>::type
        as(const Json& j)
        {
            std::error_code ec;
            if (j.is_array())
            {
                T result;
                visit_reserve_(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(),result,j.size());
                for (const auto& item : j.array_range())
                {
                    result.push_back(item.template as<value_type>());
                }

                return result;
            }
            else if (j.is_byte_string_view())
            {
                value_converter<byte_string_view,T> converter;
                auto v = converter.convert(j.as_byte_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else if (j.is_string())
            {
                value_converter<basic_string_view<char>,T> converter;
                auto v = converter.convert(j.as_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_vector));
            }
        }